

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

int os_system_linux_netlink_addreq
              (os_system_netlink *nl,nlmsghdr *nlmsg,int type,void *data,int len)

{
  uint uVar1;
  int iVar2;
  undefined2 *puVar3;
  size_t aligned_attr_len;
  size_t aligned_msg_len;
  nlattr *nl_attr;
  int len_local;
  void *data_local;
  int type_local;
  nlmsghdr *nlmsg_local;
  os_system_netlink *nl_local;
  
  uVar1 = nlmsg->nlmsg_len + 3 & 0xfffffffc;
  iVar2 = len + 4;
  if ((ulong)uVar1 + (long)iVar2 < 0x401) {
    puVar3 = (undefined2 *)((long)&nlmsg->nlmsg_len + (ulong)uVar1);
    puVar3[1] = (short)type;
    *puVar3 = (short)iVar2;
    nlmsg->nlmsg_len = uVar1 + iVar2;
    if (len != 0) {
      memcpy(puVar3 + 2,data,(long)len);
    }
    nl_local._4_4_ = 0;
  }
  else {
    if (((&log_global_mask)[_oonf_os_system_subsystem.logging] & 4) != 0) {
      oonf_log(4,_oonf_os_system_subsystem.logging,"src/base/os_linux/os_system_linux.c",0x1c2,0,0,
               "Netlink \'%s\' message got too large!",nl->name);
    }
    nl_local._4_4_ = -1;
  }
  return nl_local._4_4_;
}

Assistant:

int
os_system_linux_netlink_addreq(
  struct os_system_netlink *nl, struct nlmsghdr *nlmsg, int type, const void *data, int len) {
  struct nlattr *nl_attr;
  size_t aligned_msg_len, aligned_attr_len;

  /* calculate aligned length of message and new attribute */
  aligned_msg_len = NLMSG_ALIGN(nlmsg->nlmsg_len);
  aligned_attr_len = NLA_HDRLEN + len;

  if (aligned_msg_len + aligned_attr_len > UIO_MAXIOV) {
    OONF_WARN(LOG_OS_SYSTEM, "Netlink '%s' message got too large!", nl->name);
    return -1;
  }

  nl_attr = (struct nlattr *)((void *)((char *)nlmsg + aligned_msg_len));
  nl_attr->nla_type = type;
  nl_attr->nla_len = aligned_attr_len;

  /* fix length of netlink message */
  nlmsg->nlmsg_len = aligned_msg_len + aligned_attr_len;

  if (len) {
    memcpy((char *)nl_attr + NLA_HDRLEN, data, len);
  }
  return 0;
}